

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O2

void __thiscall google::protobuf::internal::MicroString::DestroySlow(MicroString *this)

{
  LargeRepKind LVar1;
  StringRep *pSVar2;
  LargeRep *pLVar3;
  MicroRep *pMVar4;
  ulong uStack_20;
  
  if (((ulong)this->rep_ & 2) == 0) {
    LVar1 = large_rep_kind(this);
    if (LVar1 == kAlias) {
      pSVar2 = (StringRep *)large_rep(this);
      uStack_20 = 0x10;
    }
    else if (LVar1 == kString) {
      pSVar2 = string_rep(this);
      if (pSVar2 != (StringRep *)0x0) {
        std::__cxx11::string::~string((string *)&pSVar2->str);
      }
      uStack_20 = 0x30;
    }
    else {
      if (LVar1 != kOwned) {
        return;
      }
      pSVar2 = (StringRep *)large_rep(this);
      pLVar3 = large_rep(this);
      uStack_20 = (ulong)pLVar3->capacity + 0x10;
    }
  }
  else {
    pSVar2 = (StringRep *)micro_rep(this);
    pMVar4 = micro_rep(this);
    uStack_20 = (ulong)pMVar4->capacity + 2;
  }
  operator_delete(pSVar2,uStack_20);
  return;
}

Assistant:

void MicroString::DestroySlow() {
  if (is_micro_rep()) {
    internal::SizedDelete(micro_rep(), MicroRepSize(micro_rep()->capacity));
    return;
  }

  switch (large_rep_kind()) {
    case kOwned:
      internal::SizedDelete(large_rep(), OwnedRepSize(large_rep()->capacity));
      break;
    case kString:
      delete string_rep();
      break;
    case kAlias:
      delete large_rep();
      break;
    case kUnowned:
      // Nothing to destroy.
      break;
  }
}